

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_12a29d3::SpeakerDelegate::speaker_did_complete_samples
          (SpeakerDelegate *this,Speaker *param_1,vector<short,_std::allocator<short>_> *buffer)

{
  const_iterator __first;
  const_iterator __position;
  
  std::mutex::lock(&this->audio_buffer_mutex_);
  __first._M_current =
       (this->audio_buffer_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
       super__Vector_impl_data._M_start;
  __position._M_current =
       (this->audio_buffer_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((ulong)this->is_stereo * 0x400 + 0x400 <
      (ulong)((long)__position._M_current - (long)__first._M_current >> 1)) {
    std::vector<short,_std::allocator<short>_>::erase
              (&this->audio_buffer_,__first,
               (const_iterator)
               (__position._M_current + ((ulong)(byte)~this->is_stereo << 0xb | 0xfffffffffffff000))
              );
    __position._M_current =
         (this->audio_buffer_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  std::vector<short,std::allocator<short>>::
  insert<__gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>,void>
            ((vector<short,std::allocator<short>> *)&this->audio_buffer_,__position,
             (__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>)
             (buffer->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>)
             (buffer->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  pthread_mutex_unlock((pthread_mutex_t *)&this->audio_buffer_mutex_);
  return;
}

Assistant:

void speaker_did_complete_samples(Outputs::Speaker::Speaker *, const std::vector<int16_t> &buffer) final {
		std::lock_guard lock_guard(audio_buffer_mutex_);
		const size_t buffer_size = buffered_samples * (is_stereo ? 2 : 1);
		if(audio_buffer_.size() > buffer_size) {
			audio_buffer_.erase(audio_buffer_.begin(), audio_buffer_.end() - buffer_size);
		}
		audio_buffer_.insert(audio_buffer_.end(), buffer.begin(), buffer.end());
	}